

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O2

void __thiscall wasm::LocalAnalyzer::visitLocalGet(LocalAnalyzer *this,LocalGet *curr)

{
  pointer puVar1;
  ulong __n;
  reference rVar2;
  
  __n = (ulong)curr->index;
  if ((this->numSets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[__n] == 0) {
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->sfa,__n);
    *rVar2._M_p = *rVar2._M_p & ~rVar2._M_mask;
    __n = (ulong)curr->index;
  }
  puVar1 = (this->numGets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + __n;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
    if (numSets[curr->index] == 0) {
      sfa[curr->index] = false;
    }
    numGets[curr->index]++;
  }